

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O2

string * __thiscall
umu::_union_map_union_Union__0__::get_string_abi_cxx11_
          (string *__return_storage_ptr__,_union_map_union_Union__0__ *this)

{
  Exception *this_00;
  any *in_RDX;
  allocator<char> local_39;
  string local_38;
  
  if (this->idx_ == 0) {
    boost::any_cast<std::__cxx11::string>(__return_storage_ptr__,(boost *)&this->value_,in_RDX);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid type for union",&local_39);
  avro::Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
std::string _union_map_union_Union__0__::get_string() const {
    if (idx_ != 0) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::string >(value_);
}